

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O1

void __thiscall Assimp::Discreet3DSImporter::ParseEditorChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  bool bVar1;
  short sVar2;
  uint _limit;
  Logger *this_01;
  size_t sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  char *pcVar9;
  char *pcVar10;
  Chunk chunk;
  char buff [10];
  Chunk local_1f8;
  char local_1f2;
  char local_1f1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  long *local_1c8;
  long local_1b8 [2];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a8 [112];
  ios_base local_138 [264];
  
  if (5 < (uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current)) {
    do {
      ReadChunk(this,&local_1f8);
      if (0 < (int)(local_1f8.Size - 6)) {
        this_00 = this->stream;
        _limit = StreamReader<false,_false>::SetReadLimit
                           (this_00,(local_1f8.Size - 6) +
                                    (*(int *)&this_00->current - *(int *)&this_00->buffer));
        if (local_1f8.Flag == 2) {
          sVar2 = StreamReader<false,_false>::Get<short>(this->stream);
          iVar4 = (int)sVar2;
          uVar6 = 1;
          if (sVar2 < 0) {
            local_1f2 = '-';
            iVar4 = -iVar4;
            uVar6 = 2;
            pcVar9 = local_1f1;
          }
          else {
            pcVar9 = &local_1f2;
          }
          iVar7 = 1000000000;
          bVar8 = false;
          do {
            pcVar10 = pcVar9;
            if (9 < uVar6) break;
            iVar5 = iVar4 % iVar7;
            if (((bVar8) || (iVar7 == 1)) || ((int)((long)iVar4 / (long)iVar7) != 0)) {
              pcVar10 = pcVar9 + 1;
              uVar6 = uVar6 + 1;
              *pcVar9 = (char)((long)iVar4 / (long)iVar7) + '0';
              bVar8 = true;
              pcVar9 = pcVar10;
              iVar4 = iVar5;
              if (iVar7 != 1) goto LAB_003f9b6e;
              bVar1 = false;
              iVar7 = 1;
            }
            else {
LAB_003f9b6e:
              iVar7 = iVar7 / 10;
              bVar1 = true;
              pcVar10 = pcVar9;
            }
            pcVar9 = pcVar10;
          } while (bVar1);
          *pcVar10 = '\0';
          this_01 = DefaultLogger::get();
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1e8,"3DS file format version: ","");
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>(local_1a8,&local_1e8);
          sVar3 = strlen(&local_1f2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1f2,sVar3);
          std::__cxx11::stringbuf::str();
          Logger::info(this_01,(char *)local_1c8);
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8,local_1b8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
        }
        else if (local_1f8.Flag == 0xb000) {
          ParseKeyframeChunk(this);
        }
        else if (local_1f8.Flag == 0x3d3d) {
          ParseObjectChunk(this);
        }
        this->stream->current = this->stream->limit;
        StreamReader<false,_false>::SetReadLimit(this->stream,_limit);
        if (*(int *)&this->stream->limit == *(int *)&this->stream->current) {
          return;
        }
      }
    } while (5 < (uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current));
  }
  return;
}

Assistant:

void Discreet3DSImporter::ParseEditorChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_OBJMESH:

        ParseObjectChunk();
        break;

    // NOTE: In several documentations in the internet this
    // chunk appears at different locations
    case Discreet3DS::CHUNK_KEYFRAMER:

        ParseKeyframeChunk();
        break;

    case Discreet3DS::CHUNK_VERSION:
        {
        // print the version number
        char buff[10];
        ASSIMP_itoa10(buff,stream->GetI2());
        ASSIMP_LOG_INFO_F(std::string("3DS file format version: "), buff);
        }
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}